

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaExporter::WriteNode(ColladaExporter *this,aiScene *pScene,aiNode *pNode)

{
  undefined1 *puVar1;
  string *psVar2;
  uint uVar3;
  uint uVar4;
  aiCamera **ppaVar5;
  aiCamera *paVar6;
  aiMesh *mesh;
  char *pcVar7;
  size_type sVar8;
  aiLight **ppaVar9;
  aiLight *paVar10;
  bool bVar11;
  string *psVar12;
  aiScene *pScene_00;
  int iVar13;
  aiBone *paVar14;
  aiBone *paVar15;
  size_t sVar16;
  ostream *poVar17;
  long *plVar18;
  aiNode *paVar19;
  long *plVar20;
  ulong uVar21;
  size_t i;
  ulong uVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  string node_name_escaped;
  stringstream ss;
  char *local_2e8;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  float local_2b0;
  float local_2a4;
  float local_2a0;
  float local_29c;
  float local_298;
  allocator<char> local_291;
  string *local_290;
  string local_288;
  string local_268;
  aiScene *local_248;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  undefined8 uStack_198;
  float local_190;
  undefined8 local_18c;
  undefined8 uStack_184;
  float local_17c;
  ios_base local_138 [264];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"Node_",5);
    std::ostream::_M_insert<void_const*>((ostream *)(local_1b8 + 0x10));
    std::__cxx11::stringbuf::str();
    sVar8 = local_288._M_string_length;
    if (local_288._M_string_length < 0x400) {
      (pNode->mName).length = (ai_uint32)local_288._M_string_length;
      memcpy((pNode->mName).data,local_288._M_dataplus._M_p,local_288._M_string_length);
      (pNode->mName).data[sVar8] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  local_290 = (string *)(pNode->mName).data;
  local_248 = pScene;
  paVar14 = findBone(pScene,(char *)local_290);
  if (paVar14 == (aiBone *)0x0) {
    bVar11 = false;
    local_2e8 = "NODE";
  }
  else if ((pNode->mParent == (aiNode *)0x0) ||
          (paVar15 = findBone(local_248,(pNode->mParent->mName).data), paVar15 == (aiBone *)0x0)) {
    bVar11 = true;
    local_2e8 = "JOINT";
  }
  else {
    local_2e8 = "JOINT";
    bVar11 = false;
  }
  psVar12 = local_290;
  local_1b8._0_8_ = local_1b8 + 0x10;
  sVar16 = strlen((char *)local_290);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,psVar12,psVar12 + sVar16);
  XMLEscape(&local_288,(string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  puVar1 = &this->field_0x38;
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<node ",6);
  if (bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" ",2);
    if (paVar14 == (aiBone *)0x0) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    }
    else {
      std::operator+(&local_1d8,"sid=\"",&local_288);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_1b8._0_8_ = local_1b8 + 0x10;
      plVar20 = plVar18 + 2;
      if ((long *)*plVar18 == plVar20) {
        aStack_1a8._8_8_ = plVar18[3];
        aStack_1a8._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1a8._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      }
      else {
        aStack_1a8._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1a8._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
        local_1b8._0_8_ = (long *)*plVar18;
      }
      local_1b8._8_4_ = (undefined4)plVar18[1];
      local_1b8._12_4_ = (undefined4)((ulong)plVar18[1] >> 0x20);
      *plVar18 = (long)plVar20;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,(char *)local_1b8._0_8_,CONCAT44(local_1b8._12_4_,local_1b8._8_4_));
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                               aStack_1a8._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar14 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFoundSkeletonRootNodeID);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" ",2);
    if (paVar14 == (aiBone *)0x0) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    }
    else {
      std::operator+(&local_1d8,"sid=\"",&local_288);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_1b8._0_8_ = local_1b8 + 0x10;
      plVar20 = plVar18 + 2;
      if ((long *)*plVar18 == plVar20) {
        aStack_1a8._8_8_ = plVar18[3];
        aStack_1a8._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1a8._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      }
      else {
        aStack_1a8._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1a8._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
        local_1b8._0_8_ = (long *)*plVar18;
      }
      local_1b8._8_4_ = (undefined4)plVar18[1];
      local_1b8._12_4_ = (undefined4)((ulong)plVar18[1] >> 0x20);
      *plVar18 = (long)plVar20;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,(char *)local_1b8._0_8_,CONCAT44(local_1b8._12_4_,local_1b8._8_4_));
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                               aStack_1a8._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar14 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," name=\"",7);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" type=\"",8);
  sVar16 = strlen(local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,local_2e8,sVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\">",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  psVar2 = &this->startstr;
  std::__cxx11::string::append((char *)psVar2);
  local_2c0 = (pNode->mTransformation).a1;
  local_2b0 = (pNode->mTransformation).a2;
  local_2c4 = (pNode->mTransformation).a3;
  local_298 = (pNode->mTransformation).a4;
  local_2c8 = (pNode->mTransformation).b1;
  local_2b4 = (pNode->mTransformation).b2;
  local_2cc = (pNode->mTransformation).b3;
  local_29c = (pNode->mTransformation).b4;
  local_2b8 = (pNode->mTransformation).c1;
  local_2bc = (pNode->mTransformation).c2;
  local_2d0 = (pNode->mTransformation).c3;
  local_2a0 = (pNode->mTransformation).c4;
  local_2d4 = (pNode->mTransformation).d1;
  local_2d8 = (pNode->mTransformation).d2;
  local_2dc = (pNode->mTransformation).d3;
  local_2a4 = (pNode->mTransformation).d4;
  uVar21 = (ulong)this->mScene->mNumCameras;
  if (uVar21 != 0) {
    ppaVar5 = this->mScene->mCameras;
    uVar3 = (pNode->mName).length;
    uVar22 = 0;
    do {
      paVar6 = ppaVar5[uVar22];
      uVar4 = (paVar6->mName).length;
      if (uVar4 == uVar3) {
        iVar13 = bcmp((paVar6->mName).data,local_290,(ulong)uVar4);
        if (iVar13 == 0) {
          local_1b8._0_4_ = 1.0;
          local_1b8._4_4_ = 0.0;
          local_1b8._8_4_ = 0.0;
          local_1b8._12_4_ = 0.0;
          aStack_1a8._M_allocated_capacity._0_4_ = 0.0;
          aStack_1a8._M_allocated_capacity._4_4_ = 1.0;
          aStack_1a8._8_8_ = 0;
          uStack_198._0_4_ = 0.0;
          uStack_198._4_4_ = 0.0;
          local_190 = 1.0;
          local_18c._0_4_ = 0.0;
          local_18c._4_4_ = 0.0;
          uStack_184._0_4_ = 0.0;
          uStack_184._4_4_ = 0.0;
          local_17c = 1.0;
          aiCamera::GetCameraMatrix(ppaVar5[uVar22],(aiMatrix4x4 *)local_1b8);
          fVar30 = (float)local_1b8._0_4_ * 0.0 + (float)local_1b8._4_4_ * 0.0;
          fVar33 = (float)local_1b8._8_4_ * 0.0;
          fVar34 = fVar33 + fVar30 + (float)local_1b8._12_4_;
          fVar24 = (float)local_1b8._12_4_ * 0.0;
          fVar31 = ((float)local_1b8._4_4_ * 0.0 - (float)local_1b8._0_4_) + fVar33 + fVar24;
          local_20c = (float)local_1b8._4_4_ + (float)local_1b8._0_4_ * 0.0 + fVar33 + fVar24;
          fVar24 = (fVar30 - (float)local_1b8._8_4_) + fVar24;
          fVar30 = (float)aStack_1a8._M_allocated_capacity._0_4_ * 0.0 +
                   (float)aStack_1a8._M_allocated_capacity._4_4_ * 0.0;
          fVar33 = (float)aStack_1a8._8_4_ * 0.0;
          fVar38 = fVar33 + fVar30 + (float)aStack_1a8._12_4_;
          local_208 = (float)aStack_1a8._12_4_ * 0.0;
          local_200 = ((float)aStack_1a8._M_allocated_capacity._4_4_ * 0.0 -
                      (float)aStack_1a8._M_allocated_capacity._0_4_) + fVar33 + local_208;
          local_204 = (float)aStack_1a8._M_allocated_capacity._4_4_ +
                      (float)aStack_1a8._M_allocated_capacity._0_4_ * 0.0 + fVar33 + local_208;
          local_208 = (fVar30 - (float)aStack_1a8._8_4_) + local_208;
          fVar33 = (float)uStack_198 * 0.0 + uStack_198._4_4_ * 0.0;
          fVar42 = local_190 * 0.0;
          fVar43 = fVar42 + fVar33 + (float)local_18c;
          fVar30 = (float)local_18c * 0.0;
          fVar45 = (uStack_198._4_4_ * 0.0 - (float)uStack_198) + fVar42 + fVar30;
          fVar40 = uStack_198._4_4_ + (float)uStack_198 * 0.0 + fVar42 + fVar30;
          fVar30 = (fVar33 - local_190) + fVar30;
          local_1dc = local_2b0 * local_200;
          local_1e0 = local_2b0 * local_204;
          local_1e4 = local_2b0 * local_208;
          fVar33 = local_2b0 * fVar38;
          local_1e8 = local_2b4 * local_200;
          local_1ec = local_2b4 * local_204;
          local_1f0 = local_2b4 * local_208;
          fVar42 = local_2b4 * fVar38;
          local_1f4 = local_2bc * local_200;
          local_1f8 = local_2bc * local_204;
          local_1fc = local_2bc * local_208;
          fVar25 = local_2bc * fVar38;
          local_200 = local_200 * local_2d8;
          local_204 = local_204 * local_2d8;
          local_208 = local_208 * local_2d8;
          fVar38 = fVar38 * local_2d8;
          local_230 = local_20c * local_2c0;
          local_22c = fVar24 * local_2c0;
          fVar37 = local_2c0 * fVar34;
          local_228 = fVar31 * local_2c8;
          local_224 = local_20c * local_2c8;
          local_220 = fVar24 * local_2c8;
          fVar44 = local_2c8 * fVar34;
          local_21c = fVar31 * local_2b8;
          local_218 = local_20c * local_2b8;
          local_214 = fVar24 * local_2b8;
          fVar26 = local_2b8 * fVar34;
          local_210 = fVar31 * local_2d4;
          local_20c = local_20c * local_2d4;
          fVar24 = fVar24 * local_2d4;
          fVar34 = fVar34 * local_2d4;
          fVar36 = local_2c4 * fVar43;
          local_240 = fVar40 * local_2cc;
          local_23c = fVar30 * local_2cc;
          fVar39 = local_2cc * fVar43;
          local_238 = fVar45 * local_2d0;
          local_234 = fVar40 * local_2d0;
          fVar41 = local_2d0 * fVar43;
          fVar43 = fVar43 * local_2dc;
          fVar27 = local_18c._4_4_ * 0.0 + (float)uStack_184 * 0.0;
          fVar28 = uStack_184._4_4_ * 0.0;
          fVar29 = fVar28 + fVar27 + local_17c;
          fVar35 = local_17c * 0.0;
          fVar32 = ((float)uStack_184 * 0.0 - local_18c._4_4_) + fVar28 + fVar35;
          fVar28 = (float)uStack_184 + local_18c._4_4_ * 0.0 + fVar28 + fVar35;
          fVar35 = (fVar27 - uStack_184._4_4_) + fVar35;
          local_2c0 = fVar32 * local_298 + fVar45 * local_2c4 + fVar31 * local_2c0 + local_1dc;
          local_2b0 = fVar28 * local_298 + fVar40 * local_2c4 + local_230 + local_1e0;
          local_2c4 = fVar35 * local_298 + fVar30 * local_2c4 + local_22c + local_1e4;
          local_298 = local_298 * fVar29 + fVar36 + fVar37 + fVar33;
          local_2c8 = fVar32 * local_29c + fVar45 * local_2cc + local_228 + local_1e8;
          local_2b4 = fVar28 * local_29c + local_240 + local_224 + local_1ec;
          local_2cc = fVar35 * local_29c + local_23c + local_220 + local_1f0;
          local_29c = local_29c * fVar29 + fVar39 + fVar44 + fVar42;
          local_2b8 = fVar32 * local_2a0 + local_238 + local_21c + local_1f4;
          local_2bc = fVar28 * local_2a0 + local_234 + local_218 + local_1f8;
          local_2d0 = fVar35 * local_2a0 + fVar30 * local_2d0 + local_214 + local_1fc;
          local_2a0 = local_2a0 * fVar29 + fVar41 + fVar26 + fVar25;
          local_2d4 = fVar32 * local_2a4 + fVar45 * local_2dc + local_210 + local_200;
          local_2d8 = fVar28 * local_2a4 + fVar40 * local_2dc + local_20c + local_204;
          local_2dc = fVar35 * local_2a4 + fVar30 * local_2dc + fVar24 + local_208;
          local_2a4 = fVar29 * local_2a4 + fVar43 + fVar34 + fVar38;
          break;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar21 != uVar22);
  }
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<matrix sid=\"matrix\">",0x15);
  poVar17 = std::ostream::_M_insert<double>((double)local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2c4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2cc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_29c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2bc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2d4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<double>((double)local_2dc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  std::ostream::_M_insert<double>((double)local_2a4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</matrix>",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (pNode->mNumMeshes == 0) {
    uVar21 = (ulong)this->mScene->mNumCameras;
    if (uVar21 != 0) {
      ppaVar5 = this->mScene->mCameras;
      uVar3 = (pNode->mName).length;
      uVar22 = 0;
      do {
        paVar6 = ppaVar5[uVar22];
        uVar4 = (paVar6->mName).length;
        if (uVar4 == uVar3) {
          iVar13 = bcmp((paVar6->mName).data,local_290,(ulong)uVar4);
          if (iVar13 == 0) {
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"<instance_camera url=\"#",0x17);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar17,local_288._M_dataplus._M_p,local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"-camera\"/>",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            break;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    uVar21 = (ulong)this->mScene->mNumLights;
    if (uVar21 != 0) {
      ppaVar9 = this->mScene->mLights;
      uVar3 = (pNode->mName).length;
      uVar22 = 0;
      do {
        paVar10 = ppaVar9[uVar22];
        uVar4 = (paVar10->mName).length;
        if (uVar4 == uVar3) {
          iVar13 = bcmp((paVar10->mName).data,local_290,(ulong)uVar4);
          if (iVar13 == 0) {
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"<instance_light url=\"#",0x16);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar17,local_288._M_dataplus._M_p,local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"-light\"/>",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            break;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
  }
  else if (pNode->mNumMeshes != 0) {
    local_290 = (string *)&this->mFoundSkeletonRootNodeID;
    uVar21 = 0;
    do {
      mesh = this->mScene->mMeshes[pNode->mMeshes[uVar21]];
      if ((mesh->mNumFaces != 0) && (mesh->mNumVertices != 0)) {
        pcVar7 = (this->startstr)._M_dataplus._M_p;
        sVar8 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar7,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,"<instance_geometry url=\"#",0x19);
          GetMeshId_abi_cxx11_(&local_268,this,(ulong)pNode->mMeshes[uVar21]);
          XMLEscape((string *)local_1b8,&local_268);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(char *)local_1b8._0_8_,
                               CONCAT44(local_1b8._12_4_,local_1b8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\">",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,
                            CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                                     aStack_1a8._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar2);
        }
        else {
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar7,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,"<instance_controller url=\"#",0x1b);
          GetMeshId_abi_cxx11_(&local_268,this,(ulong)pNode->mMeshes[uVar21]);
          XMLEscape((string *)local_1b8,&local_268);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(char *)local_1b8._0_8_,
                               CONCAT44(local_1b8._12_4_,local_1b8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"-skin\">",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,
                            CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                                     aStack_1a8._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar2);
          paVar19 = findSkeletonRootNode(local_248,mesh);
          if (paVar19 != (aiNode *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,(paVar19->mName).data,&local_291);
            XMLEscape((string *)local_1b8,&local_268);
            std::__cxx11::string::operator=(local_290,(string *)local_1b8);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,
                              CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                                       aStack_1a8._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                               (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<skeleton>#",0xb);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(this->mFoundSkeletonRootNodeID)._M_dataplus._M_p,
                               (this->mFoundSkeletonRootNodeID)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</skeleton>",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<bind_material>",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar2);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<technique_common>",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar2);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"<instance_material symbol=\"defaultMaterial\" target=\"#",0x35);
        XMLEscape((string *)local_1b8,
                  &(this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start[mesh->mMaterialIndex].name);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(char *)local_1b8._0_8_,
                             CONCAT44(local_1b8._12_4_,local_1b8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,
                          CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                                   aStack_1a8._M_allocated_capacity._0_4_) + 1);
        }
        std::__cxx11::string::append((char *)psVar2);
        lVar23 = 0;
        do {
          if ((mesh->mTextureCoords[lVar23] != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) {
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"<bind_vertex_input semantic=\"CHANNEL",0x24);
            poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"\" input_semantic=\"TEXCOORD\" input_set=\"",0x27);
            poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"/>",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 8);
        PopTag(this);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</instance_material>",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</technique_common>",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</bind_material>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        pcVar7 = (this->startstr)._M_dataplus._M_p;
        sVar8 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar7,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</instance_geometry>",0x14);
        }
        else {
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar7,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</instance_controller>",0x16);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < pNode->mNumMeshes);
  }
  pScene_00 = local_248;
  if (pNode->mNumChildren != 0) {
    uVar21 = 0;
    do {
      WriteNode(this,pScene_00,pNode->mChildren[uVar21]);
      uVar21 = uVar21 + 1;
    } while (uVar21 < pNode->mNumChildren);
  }
  PopTag(this);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</node>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteNode( const aiScene* pScene, aiNode* pNode)
{
    // the node must have a name
    if (pNode->mName.length == 0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }

    // If the node is associated with a bone, it is a joint node (JOINT)
    // otherwise it is a normal node (NODE)
    const char * node_type;
    bool is_joint, is_skeleton_root = false;
    if (nullptr == findBone(pScene, pNode->mName.C_Str())) {
        node_type = "NODE";
        is_joint = false;
    } else {
        node_type = "JOINT";
        is_joint = true;
        if (!pNode->mParent || nullptr == findBone(pScene, pNode->mParent->mName.C_Str())) {
            is_skeleton_root = true;
        }
    }

    const std::string node_name_escaped = XMLEscape(pNode->mName.data);
	mOutput << startstr << "<node ";
	if(is_skeleton_root) {
		mOutput << "id=\"" << node_name_escaped << "\" " << (is_joint ? "sid=\"" + node_name_escaped +"\"" : "") ; // For now, only support one skeleton in a scene.
		mFoundSkeletonRootNodeID = node_name_escaped;
	} else {
		mOutput << "id=\"" << node_name_escaped << "\" " << (is_joint ? "sid=\"" + node_name_escaped +"\"": "") ;
	}
	
    mOutput << " name=\"" << node_name_escaped
            << "\" type=\"" << node_type
            << "\">" << endstr;
    PushTag();

    // write transformation - we can directly put the matrix there
    // TODO: (thom) decompose into scale - rot - quad to allow addressing it by animations afterwards
    aiMatrix4x4 mat = pNode->mTransformation;

    // If this node is a Camera node, the camera coordinate system needs to be multiplied in.
    // When importing from Collada, the mLookAt is set to 0, 0, -1, and the node transform is unchanged.
    // When importing from a different format, mLookAt is set to 0, 0, 1. Therefore, the local camera
    // coordinate system must be changed to matche the Collada specification.
    for (size_t i = 0; i<mScene->mNumCameras; i++){
        if (mScene->mCameras[i]->mName == pNode->mName){
            aiMatrix4x4 sourceView;
            mScene->mCameras[i]->GetCameraMatrix(sourceView);

            aiMatrix4x4 colladaView;
            colladaView.a1 = colladaView.c3 = -1; // move into -z space.
            mat *= (sourceView * colladaView);
            break;
        }
    }
	
	// customized, sid should be 'matrix' to match with loader code.
    //mOutput << startstr << "<matrix sid=\"transform\">";
	mOutput << startstr << "<matrix sid=\"matrix\">";
	
    mOutput << mat.a1 << " " << mat.a2 << " " << mat.a3 << " " << mat.a4 << " ";
    mOutput << mat.b1 << " " << mat.b2 << " " << mat.b3 << " " << mat.b4 << " ";
    mOutput << mat.c1 << " " << mat.c2 << " " << mat.c3 << " " << mat.c4 << " ";
    mOutput << mat.d1 << " " << mat.d2 << " " << mat.d3 << " " << mat.d4;
    mOutput << "</matrix>" << endstr;

    if(pNode->mNumMeshes==0){
        //check if it is a camera node
        for(size_t i=0; i<mScene->mNumCameras; i++){
            if(mScene->mCameras[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_camera url=\"#" << node_name_escaped << "-camera\"/>" << endstr;
                break;
            }
        }
        //check if it is a light node
        for(size_t i=0; i<mScene->mNumLights; i++){
            if(mScene->mLights[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_light url=\"#" << node_name_escaped << "-light\"/>" << endstr;
                break;
            }
        }

    }else
    // instance every geometry
    for( size_t a = 0; a < pNode->mNumMeshes; ++a )
    {
        const aiMesh* mesh = mScene->mMeshes[pNode->mMeshes[a]];
        // do not instantiate mesh if empty. I wonder how this could happen
        if( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
            continue;

        if( mesh->mNumBones == 0 )
        {
            mOutput << startstr << "<instance_geometry url=\"#" << XMLEscape(GetMeshId( pNode->mMeshes[a])) << "\">" << endstr;
            PushTag();
        }
        else
        {
            mOutput << startstr
                    << "<instance_controller url=\"#" << XMLEscape(GetMeshId( pNode->mMeshes[a])) << "-skin\">"
                    << endstr;
            PushTag();

			// note! this mFoundSkeletonRootNodeID some how affects animation, it makes the mesh attaches to armature skeleton root node.
			// use the first bone to find skeleton root
			const aiNode * skeletonRootBoneNode = findSkeletonRootNode( pScene, mesh );
			if ( skeletonRootBoneNode ) {
				mFoundSkeletonRootNodeID = XMLEscape( skeletonRootBoneNode->mName.C_Str() );
			}
            mOutput << startstr << "<skeleton>#" << mFoundSkeletonRootNodeID << "</skeleton>" << endstr;
        }
        mOutput << startstr << "<bind_material>" << endstr;
        PushTag();
        mOutput << startstr << "<technique_common>" << endstr;
        PushTag();
        mOutput << startstr << "<instance_material symbol=\"defaultMaterial\" target=\"#" << XMLEscape(materials[mesh->mMaterialIndex].name) << "\">" << endstr;
        PushTag();
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords( static_cast<unsigned int>(a) ) )
                // semantic       as in <texture texcoord=...>
                // input_semantic as in <input semantic=...>
                // input_set      as in <input set=...>
                mOutput << startstr << "<bind_vertex_input semantic=\"CHANNEL" << a << "\" input_semantic=\"TEXCOORD\" input_set=\"" << a << "\"/>" << endstr;
        }
        PopTag();
        mOutput << startstr << "</instance_material>" << endstr;
        PopTag();
        mOutput << startstr << "</technique_common>" << endstr;
        PopTag();
        mOutput << startstr << "</bind_material>" << endstr;
        
        PopTag();
        if( mesh->mNumBones == 0)
            mOutput << startstr << "</instance_geometry>" << endstr;
        else
            mOutput << startstr << "</instance_controller>" << endstr;
    }

    // recurse into subnodes
    for( size_t a = 0; a < pNode->mNumChildren; ++a )
        WriteNode( pScene, pNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</node>" << endstr;
}